

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigation.cpp
# Opt level: O3

void __thiscall despot::Navigation::PrintState(Navigation *this,State *s,ostream *out)

{
  int iVar1;
  long *plVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  char buffer [20];
  char acStack_48 [24];
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"Flag = ",7);
  plVar2 = (long *)std::ostream::operator<<((ostream *)out,*(int *)(s + 0xc) % flag_size_);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  if (0 < this->ysize_) {
    iVar6 = 0;
    do {
      iVar1 = this->xsize_;
      if (0 < iVar1) {
        lVar8 = 0;
        do {
          iVar4 = *(int *)(s + 0xc) >> (flag_bits_ & 0x1f);
          iVar3 = (int)lVar8 + iVar1 * iVar6;
          if (iVar3 == this->goal_pos_) {
            if (iVar3 == iVar4) {
              sVar5 = 6;
              pcVar7 = "T     ";
            }
            else {
              sVar5 = 6;
              pcVar7 = "G     ";
            }
          }
          else if (iVar3 == iVar4) {
            sVar5 = 6;
            pcVar7 = "R     ";
          }
          else {
            sprintf(acStack_48,"%4.3f ",
                    (this->trap_prob_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar1 * iVar6 + lVar8]);
            sVar5 = strlen(acStack_48);
            pcVar7 = acStack_48;
          }
          std::__ostream_insert<char,std::char_traits<char>>(out,pcVar7,sVar5);
          iVar1 = this->xsize_;
          lVar8 = lVar8 + 1;
        } while ((int)lVar8 < iVar1);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
      std::ostream::put((char)out);
      std::ostream::flush();
      iVar6 = iVar6 + 1;
    } while (iVar6 < this->ysize_);
  }
  return;
}

Assistant:

void Navigation::PrintState(const State& s, ostream& out) const {
	char buffer[20];
	out << "Flag = " << (s.state_id % flag_size_) << endl;
	for (int y = 0; y < ysize_; y++) {
		for (int x = 0; x < xsize_; x++) {
			int pos = y * xsize_ + x;
			if (pos == goal_pos_) {
				if ((s.state_id >> flag_bits_) == pos)
					out << "T     ";
				else
					out << "G     ";
			} else {
				if ((s.state_id >> flag_bits_) == pos)
					out << "R     ";
				else {
					sprintf(buffer, "%4.3f ", trap_prob_[pos]);
					out << buffer;
				}
			}
		}
		out << endl;
	}
}